

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderLoopTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::ShaderLoopTests::init(ShaderLoopTests *this,EVP_PKEY_CTX *ctx)

{
  DataType dataType;
  ShaderType SVar1;
  Context *pCVar2;
  undefined8 __s;
  int extraout_EAX;
  char *__s_00;
  TestCaseGroup *this_00;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *description;
  ShaderLoopCase *pSVar6;
  TestContext *testCtx;
  RenderContext *renderCtx;
  ContextInfo *contextInfo;
  size_type sVar7;
  const_reference ppTVar8;
  int local_50c;
  undefined1 local_508 [4];
  int i;
  undefined1 local_4f0 [8];
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  undefined1 local_430 [8];
  string desc_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  undefined1 local_3c8 [8];
  string name_1;
  bool isVertexCase_1;
  char *shaderTypeName_1;
  ShaderType shaderType_1;
  int shaderTypeNdx_1;
  char *loopCaseName;
  int loopCase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  undefined1 local_280 [8];
  string desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [8];
  string name;
  bool isVertexCase;
  char *shaderTypeName;
  ShaderType shaderType;
  int shaderTypeNdx;
  char *dataTypeName;
  DataType loopDataType;
  int dataTypeNdx;
  char *precisionName;
  int precision;
  TestCaseGroup *group;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [8];
  string groupDesc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string groupName;
  char *loopCountName;
  int loopCountType;
  char *loopTypeName;
  int loopType;
  ShaderLoopTests *this_local;
  
  for (loopTypeName._4_4_ = LOOPTYPE_FOR; (int)loopTypeName._4_4_ < 3;
      loopTypeName._4_4_ = loopTypeName._4_4_ + LOOPTYPE_WHILE) {
    __s_00 = getLoopTypeName(loopTypeName._4_4_);
    for (loopCountName._4_4_ = LOOPCOUNT_CONSTANT; (int)loopCountName._4_4_ < 3;
        loopCountName._4_4_ = loopCountName._4_4_ + LOOPCOUNT_UNIFORM) {
      groupName.field_2._8_8_ = getLoopCountTypeName(loopCountName._4_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,__s_00,&local_b1);
      std::operator+(&local_90,&local_b0,"_");
      __s = groupName.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,(char *)__s,
                 (allocator<char> *)(groupDesc.field_2._M_local_buf + 0xf));
      std::operator+(&local_70,&local_90,&local_e8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     &local_70,"_iterations");
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator((allocator<char> *)(groupDesc.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"Loop tests with ",(allocator<char> *)((long)&group + 7));
      std::operator+(&local_130,&local_150,(char *)groupName.field_2._8_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     &local_130," loop counter.");
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator((allocator<char> *)((long)&group + 7));
      this_00 = (TestCaseGroup *)operator_new(0x78);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      TestCaseGroup::TestCaseGroup(this_00,pCVar2,pcVar3,pcVar4);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
      for (precisionName._4_4_ = PRECISION_LOWP; (int)precisionName._4_4_ < 3;
          precisionName._4_4_ = precisionName._4_4_ + PRECISION_MEDIUMP) {
        pcVar3 = glu::getPrecisionName(precisionName._4_4_);
        for (dataTypeName._4_4_ = 0; dataTypeName._4_4_ < 2;
            dataTypeName._4_4_ = dataTypeName._4_4_ + 1) {
          dataType = init::s_countDataType[dataTypeName._4_4_];
          pcVar4 = glu::getDataTypeName(dataType);
          for (shaderTypeName._4_4_ = 0; shaderTypeName._4_4_ < 2;
              shaderTypeName._4_4_ = shaderTypeName._4_4_ + 1) {
            SVar1 = init::s_shaderTypes[shaderTypeName._4_4_];
            pcVar5 = glu::getShaderTypeName(SVar1);
            name.field_2._M_local_buf[0xf] = SVar1 == SHADERTYPE_VERTEX;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_258,"basic_",
                       (allocator<char> *)(desc.field_2._M_local_buf + 0xf));
            std::operator+(&local_238,&local_258,pcVar3);
            std::operator+(&local_218,&local_238,"_");
            std::operator+(&local_1f8,&local_218,pcVar4);
            std::operator+(&local_1d8,&local_1f8,"_");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b8,&local_1d8,pcVar5);
            std::__cxx11::string::~string((string *)&local_1d8);
            std::__cxx11::string::~string((string *)&local_1f8);
            std::__cxx11::string::~string((string *)&local_218);
            std::__cxx11::string::~string((string *)&local_238);
            std::__cxx11::string::~string((string *)&local_258);
            std::allocator<char>::~allocator((allocator<char> *)(desc.field_2._M_local_buf + 0xf));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&loopCase,__s_00,(allocator<char> *)((long)&loopCaseName + 7));
            std::operator+(&local_360,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &loopCase," loop with ");
            std::operator+(&local_340,&local_360,pcVar3);
            std::operator+(&local_320,&local_340,pcVar4);
            std::operator+(&local_300,&local_320," ");
            std::operator+(&local_2e0,&local_300,(char *)groupName.field_2._8_8_);
            std::operator+(&local_2c0,&local_2e0," iteration count in ");
            std::operator+(&local_2a0,&local_2c0,pcVar5);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_280,&local_2a0," shader.");
            std::__cxx11::string::~string((string *)&local_2a0);
            std::__cxx11::string::~string((string *)&local_2c0);
            std::__cxx11::string::~string((string *)&local_2e0);
            std::__cxx11::string::~string((string *)&local_300);
            std::__cxx11::string::~string((string *)&local_320);
            std::__cxx11::string::~string((string *)&local_340);
            std::__cxx11::string::~string((string *)&local_360);
            std::__cxx11::string::~string((string *)&loopCase);
            std::allocator<char>::~allocator((allocator<char> *)((long)&loopCaseName + 7));
            pCVar2 = (this->super_TestCaseGroup).m_context;
            pcVar5 = (char *)std::__cxx11::string::c_str();
            description = (char *)std::__cxx11::string::c_str();
            pSVar6 = createGenericLoopCase
                               (pCVar2,pcVar5,description,(bool)(name.field_2._M_local_buf[0xf] & 1)
                                ,loopTypeName._4_4_,loopCountName._4_4_,precisionName._4_4_,dataType
                               );
            tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)local_280);
            std::__cxx11::string::~string((string *)local_1b8);
          }
        }
      }
      for (loopCaseName._0_4_ = LOOPCASE_EMPTY_BODY; (int)(LoopCase)loopCaseName < 0x1d;
          loopCaseName._0_4_ =
               (LoopCase)loopCaseName + LOOPCASE_INFINITE_WITH_UNCONDITIONAL_BREAK_FIRST) {
        pcVar3 = getLoopCaseName((LoopCase)loopCaseName);
        if (((LoopCase)loopCaseName != LOOPCASE_NO_ITERATIONS) ||
           (loopTypeName._4_4_ != LOOPTYPE_DO_WHILE)) {
          for (shaderTypeName_1._4_4_ = 0; shaderTypeName_1._4_4_ < 2;
              shaderTypeName_1._4_4_ = shaderTypeName_1._4_4_ + 1) {
            SVar1 = init::s_shaderTypes[shaderTypeName_1._4_4_];
            pcVar4 = glu::getShaderTypeName(SVar1);
            name_1.field_2._M_local_buf[0xf] = SVar1 == SHADERTYPE_VERTEX;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_408,pcVar3,
                       (allocator<char> *)(desc_1.field_2._M_local_buf + 0xf));
            std::operator+(&local_3e8,&local_408,"_");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_3c8,&local_3e8,pcVar4);
            std::__cxx11::string::~string((string *)&local_3e8);
            std::__cxx11::string::~string((string *)&local_408);
            std::allocator<char>::~allocator((allocator<char> *)(desc_1.field_2._M_local_buf + 0xf))
            ;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4d0,pcVar3,
                       (allocator<char> *)
                       ((long)&children.
                               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            std::operator+(&local_4b0,&local_4d0," loop with ");
            std::operator+(&local_490,&local_4b0,__s_00);
            std::operator+(&local_470,&local_490," iteration count in ");
            std::operator+(&local_450,&local_470,pcVar4);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_430,&local_450," shader.");
            std::__cxx11::string::~string((string *)&local_450);
            std::__cxx11::string::~string((string *)&local_470);
            std::__cxx11::string::~string((string *)&local_490);
            std::__cxx11::string::~string((string *)&local_4b0);
            std::__cxx11::string::~string((string *)&local_4d0);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&children.
                               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            pCVar2 = (this->super_TestCaseGroup).m_context;
            pcVar4 = (char *)std::__cxx11::string::c_str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            pSVar6 = createSpecialLoopCase
                               (pCVar2,pcVar4,pcVar5,(bool)(name_1.field_2._M_local_buf[0xf] & 1),
                                (LoopCase)loopCaseName,loopTypeName._4_4_,loopCountName._4_4_);
            tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)local_430);
            std::__cxx11::string::~string((string *)local_3c8);
          }
        }
      }
      std::__cxx11::string::~string((string *)local_110);
      std::__cxx11::string::~string((string *)local_50);
    }
  }
  testCtx = Context::getTestContext((this->super_TestCaseGroup).m_context);
  renderCtx = Context::getRenderContext((this->super_TestCaseGroup).m_context);
  contextInfo = Context::getContextInfo((this->super_TestCaseGroup).m_context);
  deqp::gls::ShaderLibrary::ShaderLibrary((ShaderLibrary *)local_508,testCtx,renderCtx,contextInfo);
  deqp::gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_4f0,
             (ShaderLibrary *)local_508,"shaders/loops.test");
  deqp::gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)local_508);
  for (local_50c = 0;
      sVar7 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::size
                        ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_4f0),
      local_50c < (int)sVar7; local_50c = local_50c + 1) {
    ppTVar8 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::operator[]
                        ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_4f0,
                         (long)local_50c);
    tcu::TestNode::addChild((TestNode *)this,*ppTVar8);
  }
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~vector
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_4f0);
  return extraout_EAX;
}

Assistant:

void ShaderLoopTests::init (void)
{
	// Loop cases.

	static const ShaderType s_shaderTypes[] =
	{
		SHADERTYPE_VERTEX,
		SHADERTYPE_FRAGMENT
	};

	static const DataType s_countDataType[] =
	{
		TYPE_INT,
		TYPE_FLOAT
	};

	for (int loopType = 0; loopType < LOOPTYPE_LAST; loopType++)
	{
		const char* loopTypeName = getLoopTypeName((LoopType)loopType);

		for (int loopCountType = 0; loopCountType < LOOPCOUNT_LAST; loopCountType++)
		{
			const char* loopCountName = getLoopCountTypeName((LoopCountType)loopCountType);

			string groupName = string(loopTypeName) + "_" + string(loopCountName) + "_iterations";
			string groupDesc = string("Loop tests with ") + loopCountName + " loop counter.";
			TestCaseGroup* group = new TestCaseGroup(m_context, groupName.c_str(), groupDesc.c_str());
			addChild(group);

			// Generic cases.

			for (int precision = 0; precision < PRECISION_LAST; precision++)
			{
				const char* precisionName = getPrecisionName((Precision)precision);

				for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_countDataType); dataTypeNdx++)
				{
					DataType loopDataType = s_countDataType[dataTypeNdx];
					const char* dataTypeName = getDataTypeName(loopDataType);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char*	shaderTypeName	= getShaderTypeName(shaderType);
						bool		isVertexCase	= (shaderType == SHADERTYPE_VERTEX);

						string name = string("basic_") + precisionName + "_" + dataTypeName + "_" + shaderTypeName;
						string desc = string(loopTypeName) + " loop with " + precisionName + dataTypeName + " " + loopCountName + " iteration count in " + shaderTypeName + " shader.";
						group->addChild(createGenericLoopCase(m_context, name.c_str(), desc.c_str(), isVertexCase, (LoopType)loopType, (LoopCountType)loopCountType, (Precision)precision, loopDataType));
					}
				}
			}

			// Special cases.

			for (int loopCase = 0; loopCase < LOOPCASE_LAST; loopCase++)
			{
				const char* loopCaseName = getLoopCaseName((LoopCase)loopCase);

				// no-iterations not possible with do-while.
				if ((loopCase == LOOPCASE_NO_ITERATIONS) && (loopType == LOOPTYPE_DO_WHILE))
					continue;

				for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
				{
					ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
					const char*	shaderTypeName	= getShaderTypeName(shaderType);
					bool		isVertexCase	= (shaderType == SHADERTYPE_VERTEX);

					string name = string(loopCaseName) + "_" + shaderTypeName;
					string desc = string(loopCaseName) + " loop with " + loopTypeName + " iteration count in " + shaderTypeName + " shader.";
					group->addChild(createSpecialLoopCase(m_context, name.c_str(), desc.c_str(), isVertexCase, (LoopCase)loopCase, (LoopType)loopType, (LoopCountType)loopCountType));
				}
			}
		}
	}

	// Additional smaller handwritten tests.
	const std::vector<tcu::TestNode*> children = gls::ShaderLibrary(m_context.getTestContext(), m_context.getRenderContext(), m_context.getContextInfo()).loadShaderFile("shaders/loops.test");
	for (int i = 0; i < (int)children.size(); i++)
		addChild(children[i]);
}